

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mersenne_twister.hpp
# Opt level: O0

void __thiscall
boost::random::
mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
::twist(mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
        *this)

{
  uint y;
  uint y_4;
  size_t j_3;
  uint y_3;
  size_t j_2;
  uint y_2;
  size_t j_1;
  uint y_1;
  size_t j;
  size_t unroll_extra2;
  size_t unroll_extra1;
  size_t unroll_factor;
  uint lower_mask;
  uint upper_mask;
  mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
  *this_local;
  
  for (j = 0; j < 0xde; j = j + 1) {
    this->x[j] = this->x[j + 0x18d] ^ (this->x[j] & 0x80000000 | this->x[j + 1] & 0x7fffffff) >> 1 ^
                 (this->x[j + 1] & 1) * -0x66f74f21;
  }
  for (j_1 = 0xde; j_1 < 0xe3; j_1 = j_1 + 1) {
    this->x[j_1] = this->x[j_1 + 0x18d] ^
                   (this->x[j_1] & 0x80000000 | this->x[j_1 + 1] & 0x7fffffff) >> 1 ^
                   (this->x[j_1 + 1] & 1) * -0x66f74f21;
  }
  for (j_2 = 0xe3; j_2 < 0x26f; j_2 = j_2 + 1) {
    this->x[j_2] = *(uint *)((long)this + (j_2 - 0xe3) * 4) ^
                   (this->x[j_2] & 0x80000000 | this->x[j_2 + 1] & 0x7fffffff) >> 1 ^
                   (this->x[j_2 + 1] & 1) * -0x66f74f21;
  }
  for (j_3 = 0x26f; j_3 < 0x26f; j_3 = j_3 + 1) {
    this->x[j_3] = *(uint *)((long)this + (j_3 - 0xe3) * 4) ^
                   (this->x[j_3] & 0x80000000 | this->x[j_3 + 1] & 0x7fffffff) >> 1 ^
                   (this->x[j_3 + 1] & 1) * -0x66f74f21;
  }
  this->x[0x26f] =
       this->x[0x18c] ^ (this->x[0x26f] & 0x80000000 | this->x[0] & 0x7fffffff) >> 1 ^
       (this->x[0] & 1) * -0x66f74f21;
  this->i = 0;
  return;
}

Assistant:

void
mersenne_twister_engine<UIntType,w,n,m,r,a,u,d,s,b,t,c,l,f>::twist()
{
    const UIntType upper_mask = (~static_cast<UIntType>(0)) << r;
    const UIntType lower_mask = ~upper_mask;

    const std::size_t unroll_factor = 6;
    const std::size_t unroll_extra1 = (n-m) % unroll_factor;
    const std::size_t unroll_extra2 = (m-1) % unroll_factor;

    // split loop to avoid costly modulo operations
    {  // extra scope for MSVC brokenness w.r.t. for scope
        for(std::size_t j = 0; j < n-m-unroll_extra1; j++) {
            UIntType y = (x[j] & upper_mask) | (x[j+1] & lower_mask);
            x[j] = x[j+m] ^ (y >> 1) ^ ((x[j+1]&1) * a);
        }
    }
    {
        for(std::size_t j = n-m-unroll_extra1; j < n-m; j++) {
            UIntType y = (x[j] & upper_mask) | (x[j+1] & lower_mask);
            x[j] = x[j+m] ^ (y >> 1) ^ ((x[j+1]&1) * a);
        }
    }
    {
        for(std::size_t j = n-m; j < n-1-unroll_extra2; j++) {
            UIntType y = (x[j] & upper_mask) | (x[j+1] & lower_mask);
            x[j] = x[j-(n-m)] ^ (y >> 1) ^ ((x[j+1]&1) * a);
        }
    }
    {
        for(std::size_t j = n-1-unroll_extra2; j < n-1; j++) {
            UIntType y = (x[j] & upper_mask) | (x[j+1] & lower_mask);
            x[j] = x[j-(n-m)] ^ (y >> 1) ^ ((x[j+1]&1) * a);
        }
    }
    // last iteration
    UIntType y = (x[n-1] & upper_mask) | (x[0] & lower_mask);
    x[n-1] = x[m-1] ^ (y >> 1) ^ ((x[0]&1) * a);
    i = 0;
}